

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decSetMaxValue(decNumber *dn,decContext *set)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  
  iVar1 = set->digits;
  dn->digits = iVar1;
  puVar2 = dn->lsu;
  for (iVar3 = iVar1; 1 < iVar3; iVar3 = iVar3 + -1) {
    *puVar2 = '\t';
    puVar2 = puVar2 + 1;
  }
  iVar3 = 1;
  if (iVar1 < 1) {
    iVar3 = iVar1;
  }
  *puVar2 = (char)DECPOWERS[iVar3] + 0xff;
  dn->bits = '\0';
  dn->exponent = (set->emax - set->digits) + 1;
  return;
}

Assistant:

static void decSetMaxValue(decNumber *dn, decContext *set) {
  Unit *up;                        /* work  */
  Int count=set->digits;           /* nines to add  */
  dn->digits=count;
  /* fill in all nines to set maximum value  */
  for (up=dn->lsu; ; up++) {
    if (count>DECDPUN) *up=DECDPUNMAX;  /* unit full o'nines  */
     else {                             /* this is the msu  */
      *up=(Unit)(powers[count]-1);
      break;
      }
    count-=DECDPUN;                /* filled those digits  */
    } /* up  */
  dn->bits=0;                      /* + sign  */
  dn->exponent=set->emax-set->digits+1;
  }